

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O1

void __thiscall
duckdb::WindowValueExecutor::WindowValueExecutor
          (WindowValueExecutor *this,BoundWindowExpression *wexpr,ClientContext *context,
          WindowSharedExpressions *shared)

{
  pointer pBVar1;
  iterator __position;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  reference pvVar3;
  column_t cVar4;
  BoundOrderByNode *order;
  pointer pBVar5;
  column_t local_38;
  
  WindowExecutor::WindowExecutor(&this->super_WindowExecutor,wexpr,context,shared);
  (this->super_WindowExecutor)._vptr_WindowExecutor =
       (_func_int **)&PTR__WindowValueExecutor_019cbef8;
  *(undefined4 *)&this->child_idx = 0xffffffff;
  *(undefined4 *)((long)&this->child_idx + 4) = 0xffffffff;
  *(undefined4 *)&this->nth_idx = 0xffffffff;
  *(undefined4 *)((long)&this->nth_idx + 4) = 0xffffffff;
  *(undefined4 *)&this->offset_idx = 0xffffffff;
  *(undefined4 *)((long)&this->offset_idx + 4) = 0xffffffff;
  *(undefined4 *)&this->default_idx = 0xffffffff;
  *(undefined4 *)((long)&this->default_idx + 4) = 0xffffffff;
  pvVar2 = &(this->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>;
  (pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pBVar5 = (wexpr->arg_orders).
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pBVar1 = (wexpr->arg_orders).
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pBVar5 != pBVar1) {
    do {
      local_38 = WindowSharedExpressions::RegisterExpr(&pBVar5->expression,&shared->sink_shared);
      __position._M_current =
           (this->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
        _M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->arg_order_idx,
                   __position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        (this->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar1);
  }
  if ((wexpr->children).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (wexpr->children).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](&wexpr->children,0);
    cVar4 = WindowSharedExpressions::RegisterCollection(shared,pvVar3,wexpr->ignore_nulls);
    this->child_idx = cVar4;
    if (8 < (ulong)((long)(wexpr->children).
                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(wexpr->children).
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)) {
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](&wexpr->children,1);
      cVar4 = WindowSharedExpressions::RegisterExpr(pvVar3,&shared->eval_shared);
      this->nth_idx = cVar4;
    }
  }
  cVar4 = WindowSharedExpressions::RegisterExpr(&wexpr->offset_expr,&shared->eval_shared);
  this->offset_idx = cVar4;
  cVar4 = WindowSharedExpressions::RegisterExpr(&wexpr->default_expr,&shared->eval_shared);
  this->default_idx = cVar4;
  return;
}

Assistant:

WindowValueExecutor::WindowValueExecutor(BoundWindowExpression &wexpr, ClientContext &context,
                                         WindowSharedExpressions &shared)
    : WindowExecutor(wexpr, context, shared) {

	for (const auto &order : wexpr.arg_orders) {
		arg_order_idx.emplace_back(shared.RegisterSink(order.expression));
	}

	//	The children have to be handled separately because only the first one is global
	if (!wexpr.children.empty()) {
		child_idx = shared.RegisterCollection(wexpr.children[0], wexpr.ignore_nulls);

		if (wexpr.children.size() > 1) {
			nth_idx = shared.RegisterEvaluate(wexpr.children[1]);
		}
	}

	offset_idx = shared.RegisterEvaluate(wexpr.offset_expr);
	default_idx = shared.RegisterEvaluate(wexpr.default_expr);
}